

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Common.cpp
# Opt level: O0

void idx2::BuildSubbands(idx2_file *Idx2,params *P)

{
  _func_int **pp_Var1;
  undefined8 uVar2;
  mallocator *pmVar3;
  byte *pbVar4;
  allocator *local_5e0;
  array<idx2::v3<int>_> *Elem_1;
  array<idx2::v3<int>_> *Elem;
  int D;
  undefined8 local_5ac;
  int local_5a4;
  int local_58c;
  int iStack_588;
  undefined8 local_574;
  v3i S3;
  undefined8 local_554;
  int local_54c;
  undefined8 local_548;
  int local_540;
  undefined8 local_534;
  int local_52c;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_528;
  int local_520;
  undefined8 local_518;
  v3i F3;
  int Sb;
  undefined1 auStack_500 [3];
  u8 Mask;
  int I;
  array<idx2::array<idx2::v3<int>_>_> SubbandSpacings3;
  array<idx2::array<idx2::v3<int>_>_> SubbandFroms3;
  undefined4 local_48c;
  undefined4 local_488;
  undefined4 local_484;
  undefined8 local_480;
  v3i Spacing3;
  params *P_local;
  idx2_file *Idx2_local;
  undefined8 local_3f4;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_3e8;
  int local_3e0;
  undefined8 *local_3d8;
  undefined8 *local_3d0;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_3c4;
  allocator *local_3b8;
  array<idx2::v3<int>_> *local_3b0;
  int local_3a4;
  byte *local_3a0;
  int local_394;
  undefined8 *local_390;
  int local_384;
  undefined8 *local_380;
  int local_374;
  undefined8 *local_370;
  int local_364;
  undefined8 *local_360;
  int local_354;
  undefined8 *local_350;
  int local_344;
  undefined8 *local_340;
  int local_334;
  int local_330;
  int local_32c;
  anon_union_8_4_6ba14846_for_v2<int>_1 *local_328;
  int local_31c;
  int local_318;
  int local_314;
  undefined8 *local_310;
  int local_304;
  int local_300;
  int local_2fc;
  undefined1 *local_2f8;
  undefined8 local_2f0;
  int local_2e8;
  v3i *local_2e0;
  undefined4 *local_2d8;
  undefined8 local_2d0;
  int local_2c4;
  int local_2c0;
  int local_2bc;
  undefined8 *local_2b8;
  mallocator *local_2b0;
  allocator **local_2a8;
  mallocator *local_2a0;
  allocator **local_298;
  mallocator *local_290;
  undefined1 *local_288;
  mallocator *local_280;
  undefined1 *local_278;
  long local_270;
  undefined1 *local_268;
  long local_260;
  undefined1 *local_258;
  long local_250;
  allocator **local_248;
  long local_240;
  undefined1 *local_238;
  long local_230;
  undefined1 *local_228;
  long local_220;
  allocator **local_218;
  long local_210;
  undefined1 *local_208;
  array<idx2::subband> *local_200;
  array<idx2::subband> *local_1f8;
  array<idx2::subband> *local_1f0;
  int local_1e4;
  stack_array<idx2::array<idx2::v3<int>_>,_16> *local_1e0;
  int local_1d4;
  stack_array<idx2::array<idx2::v3<int>_>,_16> *local_1d0;
  int local_1c4;
  stack_array<idx2::array<idx2::v3<int>_>,_16> *local_1c0;
  array<idx2::v3<int>_> *local_1b8;
  undefined8 local_1b0;
  int local_1a8;
  undefined8 local_1a0;
  int local_198;
  long *local_190;
  undefined8 local_188;
  int local_180;
  undefined8 local_178;
  int local_170;
  long local_168;
  undefined8 local_160;
  int local_154;
  int local_150;
  int local_14c;
  undefined8 *local_148;
  long local_140;
  array<idx2::subband> *local_138;
  long local_130;
  array<idx2::subband> *local_128;
  long local_120;
  array<idx2::v3<int>_> *local_118;
  long local_110;
  array<idx2::v3<int>_> *local_108;
  long local_100;
  array<idx2::v3<int>_> *local_f8;
  undefined8 local_f0;
  array<idx2::v3<int>_> *local_e8;
  long local_e0;
  allocator *local_d8;
  undefined8 local_d0;
  array<idx2::v3<int>_> *local_c8;
  undefined8 local_c0;
  int local_b8;
  undefined8 local_b0;
  int local_a8;
  byte *local_a0;
  undefined8 local_98;
  int local_90;
  undefined8 local_88;
  int local_80;
  long local_78;
  undefined8 local_70;
  int local_64;
  int local_60;
  int local_5c;
  undefined8 *local_58;
  int local_4c;
  undefined1 local_45;
  int local_44;
  stack_array<unsigned_char,_16> *local_40;
  allocator **local_38;
  undefined1 *local_30;
  allocator **local_28;
  undefined1 *local_20;
  allocator **local_18;
  undefined1 *local_10;
  
  local_2fc = (Idx2->BrickDims3).field_0.field_0.X;
  local_300 = (Idx2->BrickDims3).field_0.field_0.Y;
  local_2fc = local_2fc + (uint)(1 < local_2fc);
  local_300 = local_300 + (uint)(1 < local_300);
  local_304 = (Idx2->BrickDims3).field_0.field_0.Z;
  local_304 = local_304 + (uint)(1 < local_304);
  local_2f8 = (undefined1 *)((long)&Spacing3.field_0 + 4);
  Spacing3.field_0.field_0.Y = local_2fc;
  Spacing3.field_0.field_0.Z = local_300;
  (Idx2->BrickDimsExt3).field_0.field_0.Z = local_304;
  (Idx2->BrickDimsExt3).field_0.field_3.XY.field_0 =
       (anon_union_8_4_6ba14846_for_v2<int>_1)Spacing3.field_0.field_4.YZ.field_0;
  BuildSubbands(&Idx2->BrickDimsExt3,1,Idx2->TransformOrder,&Idx2->Subbands);
  BuildSubbands(&Idx2->BrickDims3,1,Idx2->TransformOrder,&Idx2->SubbandsNonExt);
  local_2d8 = &local_48c;
  local_48c = 1;
  local_488 = 1;
  local_484 = 1;
  local_2e0 = &P->DownsamplingFactor3;
  local_2bc = 1 << (*(byte *)&local_2e0->field_0 & 0x1f);
  local_2c0 = 1 << (*(byte *)((long)&(P->DownsamplingFactor3).field_0 + 4) & 0x1f);
  Spacing3.field_0.field_0.X = 1 << (*(byte *)((long)&(P->DownsamplingFactor3).field_0 + 8) & 0x1f);
  local_2b8 = &local_2d0;
  local_2d0._0_4_ = local_2bc;
  local_2d0._4_4_ = local_2c0;
  local_2f0 = local_2d0;
  local_480 = local_2d0;
  local_2e8 = Spacing3.field_0.field_0.X;
  local_2c4 = Spacing3.field_0.field_0.X;
  local_2b0 = Mallocator();
  local_2a8 = &SubbandSpacings3.Alloc;
  local_2a0 = Mallocator();
  pmVar3 = local_2b0;
  SubbandSpacings3.Alloc = (allocator *)0x0;
  local_298 = &SubbandSpacings3.Alloc;
  local_290 = Mallocator();
  local_288 = auStack_500;
  local_280 = Mallocator();
  _auStack_500 = (array<idx2::v3<int>_> *)0x0;
  SubbandSpacings3.Buffer.Data = (byte *)0x0;
  SubbandSpacings3.Buffer.Alloc = (allocator *)0x0;
  SubbandSpacings3.Size = 0;
  SubbandSpacings3.Capacity = (i64)local_290;
  local_278 = auStack_500;
  SubbandSpacings3.Buffer.Bytes = (i64)local_280;
  Resize<idx2::array<idx2::v3<int>>>
            ((array<idx2::array<idx2::v3<int>_>_> *)&SubbandSpacings3.Alloc,(long)Idx2->NLevels);
  Resize<idx2::array<idx2::v3<int>>>
            ((array<idx2::array<idx2::v3<int>_>_> *)auStack_500,(long)Idx2->NLevels);
  Sb = 0;
  do {
    if (Sb == Idx2->NLevels) {
      local_30 = auStack_500;
      for (Elem_1 = _auStack_500; local_20 = auStack_500,
          Elem_1 != _auStack_500 + (long)SubbandSpacings3.Buffer.Alloc; Elem_1 = Elem_1 + 1) {
        local_3b0 = Elem_1;
        (*Elem_1->Alloc->_vptr_allocator[1])(Elem_1->Alloc,Elem_1);
        local_3b0->Capacity = 0;
        local_3b0->Size = 0;
      }
      local_10 = auStack_500;
      (**(code **)(*(long *)SubbandSpacings3.Capacity + 8))(SubbandSpacings3.Capacity,local_10);
      *(undefined8 *)(local_10 + 0x20) = 0;
      *(undefined8 *)(local_10 + 0x18) = 0;
      local_38 = &SubbandSpacings3.Alloc;
      for (local_5e0 = SubbandSpacings3.Alloc; local_28 = &SubbandSpacings3.Alloc,
          local_5e0 != SubbandSpacings3.Alloc; local_5e0 = local_5e0 + 6) {
        local_3b8 = local_5e0;
        (**(code **)(*local_5e0[5]._vptr_allocator + 8))(local_5e0[5]._vptr_allocator,local_5e0);
        local_3b8[4]._vptr_allocator = (_func_int **)0x0;
        local_3b8[3]._vptr_allocator = (_func_int **)0x0;
      }
      local_18 = &SubbandSpacings3.Alloc;
      (*(pmVar3->super_allocator)._vptr_allocator[1])(pmVar3,local_18);
      local_18[4] = (allocator *)0x0;
      local_18[3] = (allocator *)0x0;
      return;
    }
    local_210 = (long)Sb;
    local_208 = auStack_500;
    local_1f0 = &Idx2->Subbands;
    Resize<idx2::v3<int>>(_auStack_500 + local_210,(Idx2->Subbands).Size);
    local_220 = (long)Sb;
    local_218 = &SubbandSpacings3.Alloc;
    local_1f8 = &Idx2->Subbands;
    Resize<idx2::v3<int>>
              ((array<idx2::v3<int>_> *)(SubbandSpacings3.Alloc + local_220 * 6),
               (Idx2->Subbands).Size);
    F3.field_0.field_0.Z._3_1_ = 0xff;
    local_1c0 = &Idx2->DecodeSubbandSpacings;
    local_1c4 = Sb;
    if (0xf < Sb) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,
                    "t &idx2::stack_array<idx2::array<idx2::v3<int>>, 16>::operator[](int) const [t = idx2::array<idx2::v3<int>>, N = 16]"
                   );
    }
    local_200 = &Idx2->Subbands;
    Resize<idx2::v3<int>>(local_1c0->Arr + Sb,(Idx2->Subbands).Size);
    F3.field_0.field_0.Y = 0;
    while( true ) {
      local_230 = (long)Sb;
      local_228 = auStack_500;
      local_1b8 = _auStack_500 + local_230;
      if ((long)F3.field_0.field_0.Y == local_1b8->Size) break;
      local_128 = &Idx2->Subbands;
      local_130 = (long)F3.field_0.field_0.Y;
      local_190 = (long *)((local_128->Buffer).Data + local_130 * 0x40);
      local_168 = *local_190;
      local_14c = ((int)local_168 << 0xb) >> 0xb;
      local_148 = &local_160;
      local_150 = (int)((local_168 << 0x16) >> 0x2b);
      local_540 = (int)(local_168 * 2 >> 0x2b);
      local_160._0_4_ = local_14c;
      local_160._4_4_ = local_150;
      local_178 = local_160;
      local_1a0 = local_160;
      local_188 = local_160;
      local_1b0 = local_160;
      local_548 = local_160;
      local_534 = local_160;
      uVar2 = local_534;
      if (Sb < 1) {
        local_554._0_4_ = 1;
        local_554._4_4_ = 1;
        local_54c = 1;
      }
      else {
        local_240 = (long)(Sb + -1);
        local_238 = auStack_500;
        local_c8 = _auStack_500 + local_240;
        local_d0 = 0;
        pbVar4 = (local_c8->Buffer).Data;
        local_554 = *(undefined8 *)pbVar4;
        local_54c = *(int *)(pbVar4 + 8);
      }
      local_3d0 = &local_534;
      local_3d8 = &local_554;
      local_534._0_4_ = (int)local_160;
      local_534._4_4_ = (int)((ulong)local_160 >> 0x20);
      local_32c = (int)local_534 * (int)local_554;
      local_330 = local_534._4_4_ * local_554._4_4_;
      local_520 = local_540 * local_54c;
      local_328 = &local_3c4;
      local_3c4.field_0.X = local_32c;
      local_3c4.field_0.Y = local_330;
      local_3e8 = local_3c4;
      S3.field_0.field_4.YZ.field_0 = (v2<int>)(v2<int>)local_3c4;
      local_528 = local_3c4;
      local_250 = (long)Sb;
      local_248 = &SubbandSpacings3.Alloc;
      local_d8 = SubbandSpacings3.Alloc + local_250 * 6;
      local_e0 = (long)F3.field_0.field_0.Y;
      pp_Var1 = local_d8->_vptr_allocator;
      *(int *)((long)pp_Var1 + local_e0 * 0xc + 8) = local_520;
      *(anon_union_8_4_6ba14846_for_v2<int>_1 *)((long)pp_Var1 + local_e0 * 0xc) = local_3c4;
      F3.field_0.field_0.X = *(int *)((long)pp_Var1 + local_e0 * 0xc + 8);
      local_518 = *(undefined8 *)((long)pp_Var1 + local_e0 * 0xc);
      local_138 = &Idx2->Subbands;
      local_140 = (long)F3.field_0.field_0.Y;
      local_a0 = (local_138->Buffer).Data + local_140 * 0x40;
      local_78 = *(long *)(local_a0 + 0x10);
      local_5c = ((int)local_78 << 0xb) >> 0xb;
      local_58 = &local_70;
      local_60 = (int)((local_78 << 0x16) >> 0x2b);
      local_b8 = (int)(local_78 * 2 >> 0x2b);
      local_70._0_4_ = local_5c;
      local_70._4_4_ = local_60;
      local_88 = local_70;
      local_b0 = local_70;
      local_98 = local_70;
      local_c0 = local_70;
      if (Sb < 1) {
        local_5ac._0_4_ = 1;
        local_5ac._4_4_ = 1;
        local_5a4 = 1;
      }
      else {
        local_260 = (long)(Sb + -1);
        local_258 = auStack_500;
        local_e8 = _auStack_500 + local_260;
        local_f0 = 0;
        pbVar4 = (local_e8->Buffer).Data;
        local_5ac = *(undefined8 *)pbVar4;
        local_5a4 = *(int *)(pbVar4 + 8);
      }
      local_58c = (int)local_70;
      iStack_588 = (int)((ulong)local_70 >> 0x20);
      local_314 = local_58c * (int)local_5ac;
      local_318 = iStack_588 * local_5ac._4_4_;
      local_31c = local_b8 * local_5a4;
      local_310 = &local_3f4;
      local_3f4._0_4_ = local_314;
      local_3f4._4_4_ = local_318;
      local_270 = (long)Sb;
      local_268 = auStack_500;
      local_f8 = _auStack_500 + local_270;
      local_100 = (long)F3.field_0.field_0.Y;
      pbVar4 = (local_f8->Buffer).Data + local_100 * 0xc;
      *(undefined8 *)pbVar4 = local_3f4;
      *(int *)(pbVar4 + 8) = local_31c;
      local_574 = *(undefined8 *)pbVar4;
      S3.field_0.field_0.X = *(undefined4 *)(pbVar4 + 8);
      Elem._4_4_ = 1;
      D = 1;
      local_1d0 = &Idx2->DecodeSubbandSpacings;
      local_1d4 = Sb;
      local_534 = uVar2;
      local_52c = local_540;
      local_3e0 = local_520;
      local_334 = local_520;
      local_1a8 = local_540;
      local_198 = local_540;
      local_180 = local_540;
      local_170 = local_540;
      local_154 = local_540;
      local_a8 = local_b8;
      local_90 = local_b8;
      local_80 = local_b8;
      local_64 = local_b8;
      if (0xf < Sb) {
        __assert_fail("Idx < N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                      ,0x20c,
                      "t &idx2::stack_array<idx2::array<idx2::v3<int>>, 16>::operator[](int) const [t = idx2::array<idx2::v3<int>>, N = 16]"
                     );
      }
      local_108 = local_1d0->Arr + Sb;
      local_110 = (long)F3.field_0.field_0.Y;
      pbVar4 = (local_108->Buffer).Data + local_110 * 0xc;
      *(undefined8 *)pbVar4 = unique0x10000985;
      pbVar4[8] = '\x01';
      pbVar4[9] = '\0';
      pbVar4[10] = '\0';
      pbVar4[0xb] = '\0';
      for (Elem._0_4_ = 0; (int)Elem < 3; Elem._0_4_ = (int)Elem + 1) {
        local_344 = (int)Elem;
        local_340 = &local_518;
        if (2 < (int)Elem) {
          __assert_fail("Idx < 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                        ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
        }
        local_354 = (int)Elem;
        local_350 = &local_480;
        if (2 < (int)Elem) {
          __assert_fail("Idx < 3",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                        ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
        }
        if (*(int *)((long)local_340 + (long)(int)Elem * 4) %
            *(int *)((long)local_350 + (long)(int)Elem * 4) == 0) {
          local_360 = &local_574;
          local_364 = (int)Elem;
          if (2 < (int)Elem) {
            __assert_fail("Idx < 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
          }
          local_370 = &local_480;
          local_374 = (int)Elem;
          if (2 < (int)Elem) {
            __assert_fail("Idx < 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                          ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
          }
          if (*(int *)((long)local_360 + (long)(int)Elem * 4) %
              *(int *)((long)local_370 + (long)(int)Elem * 4) != 0) {
            local_380 = &local_480;
            local_384 = (int)Elem;
            if (2 < (int)Elem) {
              __assert_fail("Idx < 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
            }
            local_390 = &local_574;
            local_394 = (int)Elem;
            if (2 < (int)Elem) {
              __assert_fail("Idx < 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
            }
            local_1e0 = &Idx2->DecodeSubbandSpacings;
            local_1e4 = Sb;
            if (0xf < Sb) {
              __assert_fail("Idx < N",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x20c,
                            "t &idx2::stack_array<idx2::array<idx2::v3<int>>, 16>::operator[](int) const [t = idx2::array<idx2::v3<int>>, N = 16]"
                           );
            }
            local_118 = local_1e0->Arr + Sb;
            local_120 = (long)F3.field_0.field_0.Y;
            local_3a0 = (local_118->Buffer).Data + local_120 * 0xc;
            local_3a4 = (int)Elem;
            if (2 < (int)Elem) {
              __assert_fail("Idx < 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                            ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]");
            }
            *(int *)(local_3a0 + (long)(int)Elem * 4) =
                 *(int *)((long)local_380 + (long)(int)Elem * 4) /
                 *(int *)((long)local_390 + (long)(int)Elem * 4);
          }
        }
        else {
          local_45 = F3.field_0.field_0.Z._3_1_;
          local_4c = F3.field_0.field_0.Y;
          F3.field_0.field_0.Z._3_1_ =
               F3.field_0.field_0.Z._3_1_ &
               ((byte)(1L << ((byte)F3.field_0.field_0.Y & 0x3f)) ^ 0xff);
        }
      }
      F3.field_0.field_0.Y = F3.field_0.field_0.Y + 1;
    }
    if ((Sb + 1 < (int)Idx2->NLevels) && (F3.field_0.field_0.Z._3_1_ == '\x01')) {
      F3.field_0.field_0.Z._3_1_ = 0;
    }
    local_40 = &Idx2->DecodeSubbandMasks;
    local_44 = Sb;
    if (0xf < Sb) {
      __assert_fail("Idx < N",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                    ,0x20c,
                    "t &idx2::stack_array<unsigned char, 16>::operator[](int) const [t = unsigned char, N = 16]"
                   );
    }
    local_40->Arr[Sb] = F3.field_0.field_0.Z._3_1_;
    Sb = Sb + 1;
  } while( true );
}

Assistant:

static void
BuildSubbands(idx2_file* Idx2, const params& P)
{
  Idx2->BrickDimsExt3 = idx2_ExtDims(Idx2->BrickDims3);
  BuildSubbands(Idx2->BrickDimsExt3, Idx2->NTformPasses, Idx2->TransformOrder, &Idx2->Subbands);
  BuildSubbands(Idx2->BrickDims3, Idx2->NTformPasses, Idx2->TransformOrder, &Idx2->SubbandsNonExt);


  /* compute the list of subbands to decode given the downsampling factor */
  v3i Spacing3 = v3i(1) << P.DownsamplingFactor3;
  //printf("target spacing " idx2_PrStrV3i "\n", idx2_PrV3i(Spacing3));
  array<array<v3i>> SubbandFroms3;
  array<array<v3i>> SubbandSpacings3;
  Resize(&SubbandFroms3, Idx2->NLevels);
  Resize(&SubbandSpacings3, Idx2->NLevels);
  idx2_For (int, I, 0, Idx2->NLevels)
  {
    Resize(&SubbandSpacings3[I], Size(Idx2->Subbands));
    Resize(&SubbandFroms3[I], Size(Idx2->Subbands));
    u8 Mask = 0xFF;
    //printf("level %d\n", I);
    Resize(&Idx2->DecodeSubbandSpacings[I], Size(Idx2->Subbands));
    idx2_For (int, Sb, 0, Size(SubbandSpacings3[I]))
    {
      v3i F3 = SubbandFroms3[I][Sb] = From(Idx2->Subbands[Sb].Grid) * (I > 0 ? SubbandSpacings3[I - 1][0] : v3i(1));
      v3i S3 = SubbandSpacings3[I][Sb] = Strd(Idx2->Subbands[Sb].Grid) * (I > 0 ? SubbandSpacings3[I - 1][0] : v3i(1));
      //printf("subband %d from " idx2_PrStrV3i "\n", Sb, idx2_PrV3i(F3));
      //printf("subband %d spacing " idx2_PrStrV3i "\n", Sb, idx2_PrV3i(S3));
      Idx2->DecodeSubbandSpacings[I][Sb] = v3i(1);
      for (int D = 0; D < 3; ++D)
      {
        // check if a grid1 that starts at F3 with spacing S3 is a subgrid
        // of a grid2 that starts at 0 with spacing Spacing3
        if ((F3[D] % Spacing3[D]) == 0)
        {
          if ((S3[D] % Spacing3[D]) != 0)
            Idx2->DecodeSubbandSpacings[I][Sb][D] = Spacing3[D] / S3[D];
        }
        else // skip the subband
        {
          Mask = UnsetBit(Mask, Sb);
        }
      }
      //printf("subband decode spacing = " idx2_PrStrV3i "\n", idx2_PrV3i(Idx2->DecodeSubbandSpacings[I][Sb]));
    }
    if (I + 1 < Idx2->NLevels && Mask == 1)
      Mask = 0; // explicitly disable subband 0 if it is the only subband to decode
    Idx2->DecodeSubbandMasks[I] = Mask;
    //print_byte(Mask);
    //printf("\n");
  }

  idx2_ForEach (Elem, SubbandSpacings3)
    Dealloc(Elem);
  Dealloc(&SubbandSpacings3);
  idx2_ForEach (Elem, SubbandFroms3)
    Dealloc(Elem);
  Dealloc(&SubbandFroms3);
}